

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::init
          (FeedbackRecordVariableSelectionCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  ProgramSources *pPVar5;
  NotSupportedError *this_01;
  TestError *this_02;
  allocator<char> local_351;
  string source_3;
  string source_2;
  undefined1 local_308 [40];
  string source_1;
  string source;
  ContextType local_290 [8];
  undefined1 local_270 [40];
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [176];
  pointer local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  undefined1 uStack_e8;
  undefined8 uStack_e7;
  long lVar4;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (bVar2) {
      bVar2 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_geometry_shader")
      ;
      if (bVar2) goto LAB_0131d204;
    }
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,
               "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions",
               (allocator<char> *)local_270);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0131d204:
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (Functional::(anonymous_namespace)::FeedbackRecordVariableSelectionCase::init()::initialData ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::
                                 FeedbackRecordVariableSelectionCase::init()::initialData);
    if (iVar3 != 0) {
      init::initialData[0].m_data[0] = _DAT_01685050;
      init::initialData[0].m_data[1] = _UNK_01685054;
      init::initialData[0].m_data[2] = _UNK_01685058;
      init::initialData[0].m_data[3] = _UNK_0168505c;
      init::initialData[1].m_data[0] = _DAT_01685050;
      init::initialData[1].m_data[1] = _UNK_01685054;
      init::initialData[1].m_data[2] = _UNK_01685058;
      init::initialData[1].m_data[3] = _UNK_0168505c;
      init::initialData[2].m_data[0] = _DAT_01685050;
      init::initialData[2].m_data[1] = _UNK_01685054;
      init::initialData[2].m_data[2] = _UNK_01685058;
      init::initialData[2].m_data[3] = _UNK_0168505c;
      __cxa_guard_release(&Functional::(anonymous_namespace)::FeedbackRecordVariableSelectionCase::
                           init()::initialData);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_xfbBuf);
  (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_xfbBuf);
  (**(code **)(lVar4 + 0x150))(0x8c8e,0x30,init::initialData,0x88e9);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"gen xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb2f);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1a8,0,0xac);
  local_f8 = (pointer)0x0;
  uStack_f0 = 0;
  uStack_ef = 0;
  uStack_e8 = 0;
  uStack_e7 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "${VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tgl_Position = a_position;\n\ttf_feedback = vec4(1.0, 1.0, 1.0, 1.0);\n}\n"
             ,(allocator<char> *)local_308);
  local_308._0_4_ = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_1c8,&source,(ContextType *)local_308);
  std::__cxx11::string::~string((string *)&source);
  glu::VertexSource::VertexSource((VertexSource *)local_270,&local_1c8);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)local_1a8,(ShaderSource *)local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_308,
             "${VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,(allocator<char> *)&source_2);
  source_1._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_1e8,(string *)local_308,(ContextType *)&source_1);
  std::__cxx11::string::~string((string *)local_308);
  glu::FragmentSource::FragmentSource((FragmentSource *)&source,&local_1e8);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source_1,
             "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(vertices=3) out;\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tgl_TessLevelOuter[0] = 1.0;\n\tgl_TessLevelOuter[1] = 1.0;\n\tgl_TessLevelOuter[2] = 1.0;\n\tgl_TessLevelInner[0] = 1.0;\n}\n"
             ,(allocator<char> *)&source_2);
  source_2._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_208,&source_1,(ContextType *)&source_2);
  std::__cxx11::string::~string((string *)&source_1);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_308,&local_208);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source_2,
             "${VERSION_DECL}\n${EXTENSION_TESSELATION_SHADER}layout(triangles) in;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tgl_Position = gl_in[0].gl_Position * gl_TessCoord.x + gl_in[1].gl_Position * gl_TessCoord.y + gl_in[2].gl_Position * gl_TessCoord.z;\n\ttf_feedback = vec4(2.0, 2.0, 2.0, 2.0);\n}\n"
             ,(allocator<char> *)&source_3);
  source_3._M_dataplus._M_p._0_4_ =
       (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_228,&source_2,(ContextType *)&source_3);
  std::__cxx11::string::~string((string *)&source_2);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&source_1,&local_228);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&source_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source_3,
             "${VERSION_DECL}\n${EXTENSION_GEOMETRY_SHADER}layout (triangles) in;\nlayout (triangle_strip, max_vertices=3) out;\nout highp vec4 tf_feedback;\nvoid main()\n{\n\tfor (int ndx = 0; ndx < 3; ++ndx)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position + vec4(float(ndx), float(ndx)*float(ndx), 0.0, 0.0);\n\t\ttf_feedback = vec4(3.0, 3.0, 3.0, 3.0);\n\t\tEmitVertex();\n\t}\n\tEndPrimitive();\n}\n"
             ,(allocator<char> *)local_290);
  local_290[0].super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  specializeShader(&local_248,&source_3,local_290);
  std::__cxx11::string::~string((string *)&source_3);
  glu::GeometrySource::GeometrySource((GeometrySource *)&source_2,&local_248);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)&source_2);
  pPVar5->transformFeedbackBufferMode = 0x8c8c;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_290,"tf_feedback",&local_351);
  std::__cxx11::string::string((string *)&source_3,(string *)local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pPVar5->transformFeedbackVaryings,&source_3);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar5);
  this->m_program = this_00;
  std::__cxx11::string::~string((string *)&source_3);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)&source_2._M_string_length);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&source_1._M_string_length);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)(local_308 + 8));
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&source._M_string_length);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)&local_1c8);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_1a8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    return (int)this->m_program;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"could not build program",(allocator<char> *)local_270);
  tcu::TestError::TestError(this_02,(string *)local_1a8);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FeedbackRecordVariableSelectionCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	m_testCtx.getLog() << tcu::TestLog::Message << "Declaring multiple output variables with the same name in multiple shader stages. Capturing the value of the varying using transform feedback." << tcu::TestLog::EndMessage;

	// gen feedback buffer fit for 1 triangle (4 components)
	{
		static const tcu::Vec4 initialData[3] =
		{
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
			tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		m_testCtx.getLog() << tcu::TestLog::Message << "Creating buffer for transform feedback. Allocating storage for one triangle. Filling with -1.0" << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_xfbBuf);
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfbBuf);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, (int)(sizeof(tcu::Vec4[3])), initialData, GL_DYNAMIC_READ);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen xfb buf");
	}

	// gen shader
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
																	 << glu::VertexSource(getVertexSource())
																	 << glu::FragmentSource(getFragmentSource())
																	 << glu::TessellationControlSource(getTessellationControlSource())
																	 << glu::TessellationEvaluationSource(getTessellationEvaluationSource())
																	 << glu::GeometrySource(getGeometrySource())
																	 << glu::TransformFeedbackMode(GL_INTERLEAVED_ATTRIBS)
																	 << glu::TransformFeedbackVarying("tf_feedback"));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build program");
}